

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O0

void __thiscall SoftSynthMIDIDevice::SoftSynthMIDIDevice(SoftSynthMIDIDevice *this)

{
  float extraout_XMM0_Da;
  int local_38;
  SoftSynthMIDIDevice *this_local;
  
  MIDIDevice::MIDIDevice(&this->super_MIDIDevice);
  (this->super_MIDIDevice)._vptr_MIDIDevice = (_func_int **)&PTR__SoftSynthMIDIDevice_009f0f10;
  FCriticalSection::FCriticalSection(&this->CritSec);
  this->Stream = (SoundStream *)0x0;
  this->Tempo = 0.0;
  this->Division = 0.0;
  this->Events = (MIDIHDR *)0x0;
  this->Started = false;
  if (GSnd == (SoundRenderer *)0x0) {
    local_38 = 0xac44;
  }
  else {
    (*GSnd->_vptr_SoundRenderer[10])();
    local_38 = (int)extraout_XMM0_Da;
  }
  this->SampleRate = local_38;
  return;
}

Assistant:

SoftSynthMIDIDevice::SoftSynthMIDIDevice()
{
	Stream = NULL;
	Tempo = 0;
	Division = 0;
	Events = NULL;
	Started = false;
	SampleRate = GSnd != NULL ? (int)GSnd->GetOutputRate() : 44100;
}